

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall
double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  uint64_t uVar1;
  int in_ECX;
  int from;
  ulong uVar2;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  uVar2 = 0;
  for (from = value.length_; 0x12 < from; from = from + -0x13) {
    buffer._8_8_ = uVar2;
    buffer.start_ = value.start_;
    uVar1 = ReadUInt64(buffer,0x13,in_ECX);
    uVar2 = (ulong)((int)uVar2 + 0x13);
    MultiplyByPowerOfTen(this,0x13);
    AddUInt64(this,uVar1);
  }
  buffer_00._8_8_ = uVar2;
  buffer_00.start_ = value.start_;
  uVar1 = ReadUInt64(buffer_00,from,in_ECX);
  MultiplyByPowerOfTen(this,from);
  AddUInt64(this,uVar1);
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignDecimalString(const Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  static const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    const uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  const uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}